

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

int64_t __thiscall google::protobuf::MapValueConstRef::GetInt64Value(MapValueConstRef *this)

{
  CppType CVar1;
  LogMessage *pLVar2;
  char *pcVar3;
  LogFinisher local_55 [13];
  LogMessage local_48;
  MapValueConstRef *local_10;
  MapValueConstRef *this_local;
  
  local_10 = this;
  CVar1 = type(this);
  if (CVar1 != CPPTYPE_INT64) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/map_field.h"
               ,0x2b3);
    pLVar2 = internal::LogMessage::operator<<(&local_48,"Protocol Buffer map usage error:\n");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"MapValueConstRef::GetInt64Value");
    pLVar2 = internal::LogMessage::operator<<(pLVar2," type does not match\n");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"  Expected : ");
    pcVar3 = FieldDescriptor::CppTypeName(CPPTYPE_INT64);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,pcVar3);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"\n");
    pLVar2 = internal::LogMessage::operator<<(pLVar2,"  Actual   : ");
    CVar1 = type(this);
    pcVar3 = FieldDescriptor::CppTypeName(CVar1);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,pcVar3);
    internal::LogFinisher::operator=(local_55,pLVar2);
    internal::LogMessage::~LogMessage(&local_48);
  }
  return *this->data_;
}

Assistant:

int64_t GetInt64Value() const {
    TYPE_CHECK(FieldDescriptor::CPPTYPE_INT64,
               "MapValueConstRef::GetInt64Value");
    return *reinterpret_cast<int64_t*>(data_);
  }